

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

SearchResult<int,_true> __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
::binary_search_impl<std::__cxx11::string,phmap::priv::StringBtreeDefaultLess>
          (btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
           *this,undefined8 *k,uint s,uint e)

{
  void *__s2;
  int iVar1;
  ulong uVar2;
  ulong __n;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  
  uVar3 = (ulong)s;
  if (s == e) {
    uVar2 = 0x100000000;
  }
  else {
    if (((ulong)this & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xf84,
                    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                   );
    }
    __s2 = (void *)*k;
    uVar2 = k[1];
    lVar4 = 1;
    do {
      uVar5 = (int)((int)uVar3 + e) >> 1;
      __n = *(ulong *)(this + (long)(int)uVar5 * 0x40 + 0x18);
      lVar6 = __n - uVar2;
      if (uVar2 <= __n) {
        __n = uVar2;
      }
      if (__n == 0) {
        iVar1 = 0;
      }
      else {
        iVar1 = memcmp(*(void **)(this + (long)(int)uVar5 * 0x40 + 0x10),__s2,__n);
      }
      if (iVar1 == 0) {
        if (lVar6 < -0x7fffffff) {
          lVar6 = -0x80000000;
        }
        if (0x7ffffffe < lVar6) {
          lVar6 = 0x7fffffff;
        }
        iVar1 = (int)lVar6;
      }
      if (iVar1 == 0) {
        lVar4 = 0;
      }
      if (-1 < iVar1) {
        e = uVar5;
      }
      if (-1 >= iVar1) {
        uVar3 = (ulong)(uVar5 + 1);
      }
    } while ((uint)uVar3 != e);
    uVar2 = lVar4 << 0x20;
  }
  return (SearchResult<int,_true>)(uVar3 | uVar2);
}

Assistant:

SearchResult<int, true> binary_search_impl(
            const K &k, int s, int e, const CompareTo &comp,
            std::true_type /* IsCompareTo */) const {
            if (is_multi_container::value) {
                MatchKind exact_match = MatchKind::kNe;
                while (s != e) {
                    const int mid = (s + e) >> 1;
                    const phmap::weak_ordering c = comp(key(mid), k);
                    if (c < 0) {
                        s = mid + 1;
                    } else {
                        e = mid;
                        if (c == 0) {
                            // Need to return the first value whose key is not less than k,
                            // which requires continuing the binary search if this is a
                            // multi-container.
                            exact_match = MatchKind::kEq;
                        }
                    }
                }
                return {s, exact_match};
            } else {  // Not a multi-container.
                while (s != e) {
                    const int mid = (s + e) >> 1;
                    const phmap::weak_ordering c = comp(key(mid), k);
                    if (c < 0) {
                        s = mid + 1;
                    } else if (c > 0) {
                        e = mid;
                    } else {
                        return {mid, MatchKind::kEq};
                    }
                }
                return {s, MatchKind::kNe};
            }
        }